

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O0

TrackChunk rlib::midi::Smf::Inner::read<rlib::midi::Smf::Inner::TrackChunk>(istream *is)

{
  ulong uVar1;
  runtime_error *this;
  char *in_RDI;
  type buf;
  TrackChunk local_8;
  
  TrackChunk::TrackChunk(&local_8);
  std::istream::read(in_RDI,(long)&local_8);
  uVar1 = std::istream::gcount();
  if (uVar1 < 8) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"size error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_8;
}

Assistant:

static T read(std::istream& is) {
		typename std::remove_const<T>::type buf;
		if (is.read(reinterpret_cast<char*>(&buf), sizeof(buf)).gcount() < sizeof(buf)) {
			throw std::runtime_error("size error");
		}
		return buf;
	}